

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createStore(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  uint uVar1;
  SmallPtrSetImpl *Ty;
  GenericDefSite<dg::dda::RWNode> *pGVar2;
  type tVar3;
  char cVar4;
  RWNode *pRVar5;
  DataLayout *this_00;
  Offset size;
  Instruction *pIVar6;
  long lVar7;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  *__range2;
  iterator __end2;
  GenericDefSite<dg::dda::RWNode> *ds;
  pointer __v;
  TypeSize TVar8;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  defSites;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  local_48;
  
  pRVar5 = ReadWriteGraph::create(&this->graph,STORE);
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    pIVar6 = Inst + -(ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    pIVar6 = *(Instruction **)(Inst + -8);
  }
  Ty = (SmallPtrSetImpl *)**(undefined8 **)pIVar6;
  this_00 = (DataLayout *)llvm::Module::getDataLayout();
  uVar1 = *(uint *)(Ty + 8);
  if ((byte)uVar1 < 0x12) {
    if ((0xac7fU >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x30000U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_00110e3a;
      goto LAB_00110e20;
    }
  }
  else {
LAB_00110e3a:
    if ((uVar1 & 0xfe) != 0x12) {
      size.offset = 0;
      goto LAB_00110d4c;
    }
LAB_00110e20:
    size.offset = 0;
    cVar4 = llvm::Type::isSizedDerivedType(Ty);
    if (cVar4 == '\0') goto LAB_00110d4c;
  }
  TVar8 = llvm::DataLayout::getTypeAllocSize(this_00,(Type *)Ty);
  local_48.
  super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       TVar8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
       Value;
  local_48.
  super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       TVar8.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
       UnivariateDim;
  size.offset = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)&local_48);
LAB_00110d4c:
  tVar3 = Offset::UNKNOWN;
  if (size.offset == 0) {
    size.offset = Offset::UNKNOWN;
  }
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    lVar7 = (long)Inst - (ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    lVar7 = *(long *)(Inst + -8);
  }
  mapPointers(&local_48,this,(Value *)Inst,*(Value **)(lVar7 + 0x20),size);
  pGVar2 = (GenericDefSite<dg::dda::RWNode> *)
           CONCAT44(local_48.
                    super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                    (uint)local_48.
                          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  lVar7 = 0xa0;
  if (((((long)pGVar2 -
         (long)local_48.
               super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start == 0x18) &&
       (((local_48.
          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->target->type | DYN_ALLOC) == GLOBAL)) &&
      (((local_48.
         super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->offset).offset != tVar3)) &&
     (lVar7 = 0xd0,
     ((local_48.
       super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->len).offset == tVar3)) {
    lVar7 = 0xa0;
  }
  if (local_48.
      super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pGVar2) {
    __v = local_48.
          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
      ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
                ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                  *)((long)&pRVar5->_vptr_RWNode + lVar7),__v);
      __v = __v + 1;
    } while (__v != pGVar2);
  }
  if (local_48.
      super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (GenericDefSite<dg::dda::RWNode> *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pRVar5;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createStore(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::STORE);

    uint64_t size = llvmutils::getAllocatedSize(Inst->getOperand(0)->getType(),
                                                getDataLayout());
    if (size == 0)
        size = Offset::UNKNOWN;

    auto defSites = mapPointers(Inst, Inst->getOperand(1), size);

    // strong update is possible only with must aliases that point
    // to the last instance of the memory object. Since detecting that
    // is not that easy, do strong updates only on must aliases
    // of local and global variables (and, of course, we must know the offsets)
    // FIXME: ALLOCAs in recursive procedures can also yield only weak update
    bool strong_update = false;
    if (defSites.size() == 1) {
        const auto &ds = *(defSites.begin());
        strong_update = (ds.target->isAlloc() || ds.target->isGlobal()) &&
                        !ds.offset.isUnknown() && !ds.len.isUnknown();
    }

    for (const auto &ds : defSites) {
        node.addDef(ds, strong_update);
    }

    return &node;
}